

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O0

char * ucnv_io_getConverterName_63(char *alias,UBool *containsOption,UErrorCode *pErrorCode)

{
  UBool UVar1;
  uint32_t uVar2;
  int local_34;
  uint32_t convNum;
  int32_t i;
  char *aliasTmp;
  UErrorCode *pErrorCode_local;
  UBool *containsOption_local;
  char *alias_local;
  
  local_34 = 0;
  _convNum = alias;
  while( true ) {
    if (1 < local_34) {
      return (char *)0x0;
    }
    if (local_34 == 1) {
      if (*_convNum != 'x') {
        return (char *)0x0;
      }
      if (_convNum[1] != '-') {
        return (char *)0x0;
      }
      _convNum = _convNum + 2;
    }
    UVar1 = haveAliasData(pErrorCode);
    if (UVar1 == '\0') {
      return (char *)0x0;
    }
    UVar1 = isAlias(_convNum,pErrorCode);
    if (UVar1 == '\0') break;
    uVar2 = findConverter(_convNum,containsOption,pErrorCode);
    if (uVar2 < gMainTable.converterListSize) {
      return (char *)(gMainTable.stringTable + (int)(uint)gMainTable.converterList[uVar2]);
    }
    local_34 = local_34 + 1;
  }
  return (char *)0x0;
}

Assistant:

U_CAPI const char *
ucnv_io_getConverterName(const char *alias, UBool *containsOption, UErrorCode *pErrorCode) {
    const char *aliasTmp = alias;
    int32_t i = 0;
    for (i = 0; i < 2; i++) {
        if (i == 1) {
            /*
             * After the first unsuccess converter lookup, check to see if
             * the name begins with 'x-'. If it does, strip it off and try
             * again.  This behaviour is similar to how ICU4J does it.
             */
            if (aliasTmp[0] == 'x' && aliasTmp[1] == '-') {
                aliasTmp = aliasTmp+2;
            } else {
                break;
            }
        }
        if(haveAliasData(pErrorCode) && isAlias(aliasTmp, pErrorCode)) {
            uint32_t convNum = findConverter(aliasTmp, containsOption, pErrorCode);
            if (convNum < gMainTable.converterListSize) {
                return GET_STRING(gMainTable.converterList[convNum]);
            }
            /* else converter not found */
        } else {
            break;
        }
    }

    return NULL;
}